

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  float _x;
  bool bVar1;
  float _y;
  bool local_51;
  ImVec2 local_50;
  bool local_45;
  undefined4 local_44;
  bool is_open;
  ImGuiWindowFlags window_flags;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiContext *local_18;
  ImGuiContext *g;
  
  local_18 = GImGui;
  _x = (GImGui->Style).DisplaySafeAreaPadding.x;
  _y = ImMax<float>((GImGui->Style).DisplaySafeAreaPadding.y - (GImGui->Style).FramePadding.y,0.0);
  ImVec2::ImVec2(&local_20,_x,_y);
  (local_18->NextWindowData).MenuBarOffsetMinVal = local_20;
  ImVec2::ImVec2(&local_28,0.0,0.0);
  ImVec2::ImVec2(&local_30,0.0,0.0);
  SetNextWindowPos(&local_28,0,&local_30);
  ImVec2::ImVec2(&local_38,(local_18->IO).DisplaySize.x,
                 (local_18->NextWindowData).MenuBarOffsetMinVal.y + local_18->FontBaseSize +
                 (local_18->Style).FramePadding.y);
  SetNextWindowSize(&local_38,0);
  PushStyleVar(2,0.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,0.0,0.0);
  PushStyleVar(4,(ImVec2 *)&stack0xffffffffffffffc0);
  local_44 = 0x50f;
  bVar1 = Begin("##MainMenuBar",(bool *)0x0,0x50f);
  local_51 = false;
  if (bVar1) {
    local_51 = BeginMenuBar();
  }
  local_45 = local_51;
  PopStyleVar(2);
  ImVec2::ImVec2(&local_50,0.0,0.0);
  (local_18->NextWindowData).MenuBarOffsetMinVal = local_50;
  bVar1 = (local_45 & 1U) != 0;
  if (!bVar1) {
    End();
  }
  return bVar1;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    SetNextWindowPos(ImVec2(0.0f, 0.0f));
    SetNextWindowSize(ImVec2(g.IO.DisplaySize.x, g.NextWindowData.MenuBarOffsetMinVal.y + g.FontBaseSize + g.Style.FramePadding.y));
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0,0));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true;
}